

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void * lys_set_private(lys_node *node,void *priv)

{
  LY_ERR *pLVar1;
  void *prev;
  void *priv_local;
  lys_node *node_local;
  
  if (node == (lys_node *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lys_set_private");
    node_local = (lys_node *)0x0;
  }
  else {
    node_local = (lys_node *)node->priv;
    node->priv = priv;
  }
  return node_local;
}

Assistant:

API void *
lys_set_private(const struct lys_node *node, void *priv)
{
    void *prev;

    if (!node) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    prev = node->priv;
    ((struct lys_node *)node)->priv = priv;

    return prev;
}